

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O1

UEdgeVec * libDAI::RandomDRegularGraph(UEdgeVec *__return_storage_ptr__,size_t N,size_t d)

{
  pointer *ppUVar1;
  unsigned_long *__src;
  unsigned_long uVar2;
  iterator __position;
  pointer pUVar3;
  bool bVar4;
  pointer puVar5;
  int iVar6;
  pointer pUVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer puVar13;
  ulong uVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> U;
  vector<unsigned_long,_std::allocator<unsigned_long>_> degrees;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  uint local_6c;
  size_t local_68;
  pointer local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  value_type_conflict2 local_38;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (pointer)(d * N);
  puVar13 = local_60;
  local_68 = N;
LAB_004de8f9:
  do {
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&local_a8,(size_type)puVar13);
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (puVar13 != (pointer)0x0) {
      do {
        if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_88);
        }
        else {
          *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_88.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1);
      } while (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start < puVar13);
    }
    pUVar7 = (__return_storage_ptr__->
             super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
        _M_impl.super__Vector_impl_data._M_finish != pUVar7) {
      (__return_storage_ptr__->super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
      _M_impl.super__Vector_impl_data._M_finish = pUVar7;
    }
    uVar9 = 0;
    do {
      local_6c = uVar9;
      puVar5 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar13 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + 1 !=
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        lVar12 = 8;
        do {
          iVar6 = rand();
          lVar10 = (long)iVar6 % ((lVar12 >> 3) + 1);
          if (lVar12 != lVar10 * 8) {
            uVar2 = *(unsigned_long *)((long)puVar13 + lVar12);
            *(unsigned_long *)((long)puVar13 + lVar12) = puVar13[lVar10];
            puVar13[lVar10] = uVar2;
          }
          lVar10 = lVar12 + 8;
          lVar12 = lVar12 + 8;
        } while ((unsigned_long *)((long)puVar13 + lVar10) != puVar5);
      }
      if ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        bVar4 = false;
      }
      else {
        uVar11 = 2;
        lVar10 = -0x10;
        lVar12 = 0x10;
        bVar4 = false;
        uVar14 = 0;
        do {
          local_40 = uVar14 + 1;
          local_58 = lVar12;
          local_50 = lVar10;
          local_48 = uVar11;
          if (local_40 <
              (ulong)((long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) && !bVar4) {
            do {
              if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar14] / d !=
                  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar11 - 1] / d) {
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(local_a8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar14] / d);
                local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)(local_a8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar11 - 1] / d);
                __position._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::
                  _M_realloc_insert<libDAI::UEdge>
                            (__return_storage_ptr__,__position,(UEdge *)&local_88);
                }
                else {
                  (__position._M_current)->n1 =
                       (size_t)local_88.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                  (__position._M_current)->n2 =
                       (size_t)local_88.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                  ppUVar1 = &(__return_storage_ptr__->
                             super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppUVar1 = *ppUVar1 + 1;
                }
                if ((unsigned_long *)
                    ((long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar12) !=
                    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  memmove(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + (uVar11 - 1),
                          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar11,
                          (long)local_a8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                          (lVar10 - (long)local_a8.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
                }
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                __src = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar14 + 1;
                if (__src != local_a8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish) {
                  memmove(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar14,__src,
                          (long)local_a8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)__src);
                }
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                bVar4 = true;
              }
              if ((ulong)((long)local_a8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) break;
              uVar11 = uVar11 + 1;
              lVar10 = lVar10 + -8;
              lVar12 = lVar12 + 8;
            } while (!bVar4);
          }
          if (((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) - 1U <= local_40) break;
          uVar11 = local_48 + 1;
          lVar10 = local_50 + -8;
          lVar12 = local_58 + 8;
          uVar14 = local_40;
        } while (!bVar4);
      }
      uVar9 = local_6c & 0xff;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar9 = 1;
      }
      if (!bVar4) {
        uVar9 = 1;
      }
    } while ((uVar9 & 1) == 0);
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_004debac;
    puVar13 = local_60;
  } while (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start == (unsigned_long *)0x0);
  goto LAB_004dec44;
LAB_004debac:
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_88,local_68,&local_38);
  puVar13 = local_60;
  pUVar3 = (__return_storage_ptr__->
           super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pUVar7 = (__return_storage_ptr__->
                super__Vector_base<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>)._M_impl.
                super__Vector_impl_data._M_start; pUVar7 != pUVar3; pUVar7 = pUVar7 + 1) {
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[pUVar7->n1] =
         local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[pUVar7->n1] + 1;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[pUVar7->n2] =
         local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[pUVar7->n2] + 1;
  }
  if (local_68 == 0) {
LAB_004dec56:
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  sVar8 = 0;
  while (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[sVar8] == d) {
    sVar8 = sVar8 + 1;
    if (local_68 == sVar8) goto LAB_004dec56;
  }
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
LAB_004dec44:
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_004de8f9;
}

Assistant:

UEdgeVec RandomDRegularGraph( size_t N, size_t d ) {
        // Algorithm 1 in "Generating random regular graphs quickly"
        // by A. Steger and N.C. Wormald
        //
        // Draws a random graph with size N and uniform degree d
        // from an almost uniform probability distribution over these graphs
        // (which becomes uniform in the limit that d is small and N goes
        // to infinity).
        
        assert( (N * d) % 2 == 0 );

        bool ready = false;
        UEdgeVec G;

        size_t tries = 0;
        while( !ready ) {
            tries++;

            // Start with N*d points {0,1,...,N*d-1} (N*d even) in N groups.
            // Put U = {0,1,...,N*d-1}. (U denotes the set of unpaired points.)
            vector<size_t> U;
            U.reserve( N * d );
            for( size_t i = 0; i < N * d; i++ )
                U.push_back( i );

            // Repeat the following until no suitable pair can be found: Choose
            // two random points i and j in U, and if they are suitable, pair
            // i with j and delete i and j from U.
            G.clear();
            bool finished = false;
            while( !finished ) {
                random_shuffle( U.begin(), U.end() );
                size_t i1, i2;
                bool suit_pair_found = false;
                for( i1 = 0; i1 < U.size()-1 && !suit_pair_found; i1++ )
                    for( i2 = i1+1; i2 < U.size() && !suit_pair_found; i2++ )
                        if( (U[i1] / d) != (U[i2] / d) ) {
                            // they are suitable
                            suit_pair_found = true;
                            G.push_back( UEdge( U[i1] / d, U[i2] / d ) );
                            U.erase( U.begin() + i2 );  // first remove largest
                            U.erase( U.begin() + i1 );  // remove smallest
                        }
                if( !suit_pair_found || U.empty() )
                    finished = true;
            }

            if( U.empty() ) {
                // G is a graph with edge from vertex r to vertex s if and only if
                // there is a pair containing points in the r'th and s'th groups.
                // If G is d-regular, output, otherwise return to Step 1.

                vector<size_t> degrees;
                degrees.resize( N, 0 );
                for( UEdgeVec::const_iterator e = G.begin(); e != G.end(); e++ ) {
                    degrees[e->n1]++;
                    degrees[e->n2]++;
                }
                ready = true;
                for( size_t n = 0; n < N; n++ )
                    if( degrees[n] != d ) {
                        ready = false;
                        break;
                    }
            } else
                ready = false;
        }

        return G;
    }